

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O1

int asn1_string_get_abs_uint64(uint64_t *out,ASN1_STRING *a,int type)

{
  int reason;
  size_t __n;
  int line;
  uint8_t buf [8];
  
  if ((a->type & 0xfffffeffU) == type) {
    __n = (size_t)a->length;
    if ((long)__n < 9) {
      if (a->length == 0) {
        *out = 0;
        return 1;
      }
      memcpy(&stack0xfffffffffffffff8 + -__n,a->data,__n);
    }
    reason = 0xc4;
    line = 0x125;
  }
  else {
    reason = 0xc3;
    line = 0x120;
  }
  ERR_put_error(0xc,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                ,line);
  return 0;
}

Assistant:

static int asn1_string_get_abs_uint64(uint64_t *out, const ASN1_STRING *a,
                                      int type) {
  if ((a->type & ~V_ASN1_NEG) != type) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_INTEGER_TYPE);
    return 0;
  }
  uint8_t buf[sizeof(uint64_t)] = {0};
  if (a->length > (int)sizeof(buf)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_INTEGER);
    return 0;
  }
  OPENSSL_memcpy(buf + sizeof(buf) - a->length, a->data, a->length);
  *out = CRYPTO_load_u64_be(buf);
  return 1;
}